

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void nn_parse_options(nn_commandline *cline,void *target,int argc,char **argv)

{
  char **ppcVar1;
  char cVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  nn_option *pnVar7;
  char *pcVar8;
  ulong uVar9;
  nn_option *pnVar10;
  size_t __size;
  FILE *__stream;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  char *pcVar17;
  nn_parse_context ctx;
  
  pnVar10 = cline->options;
  ctx.requires = (unsigned_long)cline->required_options;
  __size = 0xffffffffffffffff;
  pnVar7 = pnVar10;
  do {
    __size = __size + 1;
    ppcVar3 = &pnVar7->longname;
    pnVar7 = pnVar7 + 1;
  } while (*ppcVar3 != (char *)0x0);
  ctx.def = cline;
  ctx.options = pnVar10;
  ctx.target = target;
  ctx.argc = argc;
  ctx.argv = argv;
  ctx.last_option_usage = (char **)calloc(8,__size);
  if (ctx.last_option_usage != (char **)0x0) {
    ctx.mask = 0;
    ctx.args_left = argc + -1;
    pcVar15 = *argv;
    ctx.arg = argv;
    pcVar8 = strrchr(pcVar15,0x2f);
    pcVar17 = pcVar8 + 1;
    if (pcVar8 == (char *)0x0) {
      pcVar17 = pcVar15;
    }
    lVar12 = 0;
    for (lVar14 = 0; *(long *)((long)&pnVar10->longname + lVar14) != 0; lVar14 = lVar14 + 0x58) {
      pcVar15 = *(char **)((long)&pnVar10->arg0name + lVar14);
      if ((pcVar15 != (char *)0x0) && (iVar4 = strcmp(pcVar17,pcVar15), iVar4 == 0)) {
        iVar4 = nn_has_arg((nn_option *)((long)&pnVar10->longname + lVar14));
        if (iVar4 != 0) {
          __assert_fail("!nn_has_arg (opt)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                        ,0x220,"void nn_parse_arg0(struct nn_parse_context *)");
        }
        ctx.last_option_usage[lVar12] = *ctx.argv;
        nn_process_option(&ctx,(int)lVar12,(char *)0x0);
        pnVar10 = ctx.options;
      }
      lVar12 = lVar12 + 1;
    }
    do {
LAB_00104086:
      do {
        ppcVar3 = ctx.arg;
        iVar4 = ctx.args_left;
        pnVar7 = ctx.options;
        if (ctx.args_left == 0) {
          nn_check_requires(&ctx);
          free(ctx.last_option_usage);
          return;
        }
        iVar16 = ctx.args_left + -1;
        ppcVar1 = ctx.arg + 1;
        pcVar15 = ctx.arg[1];
        ctx.args_left = iVar16;
        ctx.arg = ppcVar1;
        ctx.data = pcVar15;
        if (*pcVar15 != '-') {
LAB_00104355:
          pcVar15 = "%s: Unexpected argument ``%s\'\'\n";
          __stream = _stderr;
          goto LAB_0010436e;
        }
        if (pcVar15[1] != '-') {
          do {
            pcVar15 = ctx.data + 1;
            while( true ) {
              ctx.data = pcVar15;
              if (*pcVar15 == '\0') goto LAB_00104086;
              lVar12 = 0;
              pnVar7 = ctx.options;
              while( true ) {
                if (pnVar7->longname == (char *)0x0) {
                  fprintf(_stderr,"%s: Unknown option ``-%c\'\'\n",*ctx.argv);
                  goto LAB_00104339;
                }
                if (pnVar7->shortname == *pcVar15) break;
                lVar12 = lVar12 + 1;
                pnVar7 = pnVar7 + 1;
              }
              ctx.last_option_usage[lVar12] = pcVar15;
              iVar4 = nn_has_arg(pnVar7);
              iVar16 = (int)lVar12;
              if (iVar4 == 0) break;
              if (pcVar15[1] == '\0') {
                if (ctx.args_left == 0) {
                  nn_option_error("requires an argument",&ctx,iVar16);
                  goto LAB_00104355;
                }
                ctx.args_left = ctx.args_left + -1;
                pcVar15 = ctx.arg[1];
                ctx.arg = ctx.arg + 1;
                ctx.data = pcVar15;
              }
              else {
                pcVar15 = pcVar15 + 1;
              }
              nn_process_option(&ctx,iVar16,pcVar15);
              pcVar15 = "";
            }
            nn_process_option(&ctx,iVar16,(char *)0x0);
          } while( true );
        }
      } while (pcVar15[2] == '\0');
      iVar11 = 0;
      uVar9 = 0xffffffffffffffff;
      for (uVar13 = 0; pcVar17 = ctx.options[uVar13].longname, pcVar17 != (char *)0x0;
          uVar13 = uVar13 + 1) {
        for (lVar12 = 0; (cVar2 = pcVar15[lVar12 + 2], cVar2 != '=' && (cVar2 != '\0'));
            lVar12 = lVar12 + 1) {
          if (cVar2 != pcVar17[lVar12]) goto LAB_001041d8;
        }
        iVar5 = (int)lVar12;
        if (pcVar17[lVar12] == '\0') goto LAB_001041e4;
        if (iVar11 == iVar5) {
          uVar9 = 0xffffffffffffffff;
        }
        else {
          iVar6 = iVar5;
          if (iVar5 < iVar11) {
            iVar6 = iVar11;
          }
          if (iVar11 < iVar5) {
            uVar9 = uVar13;
          }
          uVar9 = uVar9 & 0xffffffff;
          iVar11 = iVar6;
        }
LAB_001041d8:
      }
      uVar13 = uVar9 & 0xffffffff;
      iVar5 = iVar11;
LAB_001041e4:
      iVar11 = (int)uVar13;
      if (iVar11 < 0) {
        __stream = _stderr;
        if (0 < iVar5) {
          fprintf(_stderr,"%s: Ambiguous option ``%s\'\':\n",*ctx.argv,pcVar15);
          for (; pnVar7->longname != (char *)0x0; pnVar7 = pnVar7 + 1) {
            for (lVar12 = 0; (cVar2 = pcVar15[lVar12 + 2], cVar2 != '=' && (cVar2 != '\0'));
                lVar12 = lVar12 + 1) {
              if (cVar2 != pnVar7->longname[lVar12]) goto LAB_00104313;
            }
            fprintf(_stderr,"    %s\n");
LAB_00104313:
          }
          goto LAB_00104339;
        }
        goto LAB_001043c0;
      }
      ctx.last_option_usage[uVar13 & 0xffffffff] = pcVar15;
      cVar2 = pcVar15[(long)iVar5 + 2];
      iVar6 = nn_has_arg(ctx.options + (uVar13 & 0xffffffff));
      if (cVar2 == '=') {
        if (iVar6 == 0) goto LAB_00104399;
        pcVar15 = pcVar15 + (long)iVar5 + 3;
      }
      else if (iVar6 == 0) {
        pcVar15 = (char *)0x0;
      }
      else {
        if (iVar16 == 0) {
          pcVar15 = "requires an argument";
          goto LAB_001043a9;
        }
        ctx.args_left = iVar4 + -2;
        ctx.arg = ppcVar3 + 2;
        pcVar15 = ppcVar3[2];
        ctx.data = pcVar15;
      }
      nn_process_option(&ctx,iVar11,pcVar15);
    } while( true );
  }
LAB_001043b6:
  __stream = (FILE *)&ctx;
  nn_memory_error((nn_parse_context *)__stream);
LAB_001043c0:
  pcVar15 = "%s: Unknown option ``%s\'\'\n";
LAB_0010436e:
  fprintf(__stream,pcVar15);
LAB_00104339:
  exit(1);
LAB_00104399:
  pcVar15 = "does not accept argument";
LAB_001043a9:
  nn_option_error(pcVar15,&ctx,iVar11);
  goto LAB_001043b6;
}

Assistant:

void nn_parse_options (struct nn_commandline *cline,
    void *target, int argc, char **argv)
{
    struct nn_parse_context ctx;
    int num_options;

    ctx.def = cline;
    ctx.options = cline->options;
    ctx.target = target;
    ctx.argc = argc;
    ctx.argv = argv;
    ctx.requires = cline->required_options;

    for (num_options = 0; ctx.options[num_options].longname; ++num_options);
    ctx.last_option_usage = calloc (sizeof (char *), num_options);
    if  (!ctx.last_option_usage)
        nn_memory_error (&ctx);

    ctx.mask = 0;
    ctx.args_left = argc - 1;
    ctx.arg = argv;

    nn_parse_arg0 (&ctx);

    while (nn_get_arg (&ctx)) {
        nn_parse_arg (&ctx);
    }

    nn_check_requires (&ctx);

    free (ctx.last_option_usage);

}